

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

int Curl_doh_done(Curl_easy *doh,CURLcode result)

{
  Curl_easy *data;
  char *pcVar1;
  
  data = (doh->set).dohfor;
  (data->req).doh.pending = (data->req).doh.pending - 1;
  Curl_infof(data,"a DOH request is completed, %u to go\n");
  if (result != CURLE_OK) {
    pcVar1 = curl_easy_strerror(result);
    Curl_infof(data,"DOH request %s\n",pcVar1);
  }
  if ((data->req).doh.pending == 0) {
    curl_slist_free_all((data->req).doh.headers);
    (data->req).doh.headers = (curl_slist *)0x0;
    Curl_expire(data,0,EXPIRE_RUN_NOW);
  }
  return 0;
}

Assistant:

static int Curl_doh_done(struct Curl_easy *doh, CURLcode result)
{
  struct Curl_easy *data = doh->set.dohfor;
  /* so one of the DOH request done for the 'data' transfer is now complete! */
  data->req.doh.pending--;
  infof(data, "a DOH request is completed, %u to go\n", data->req.doh.pending);
  if(result)
    infof(data, "DOH request %s\n", curl_easy_strerror(result));

  if(!data->req.doh.pending) {
    /* DOH completed */
    curl_slist_free_all(data->req.doh.headers);
    data->req.doh.headers = NULL;
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
  }
  return 0;
}